

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::getUpperPointer(CppGenerator *this,string *rel_name,size_t depth,bool parallelize)

{
  long in_RCX;
  string *in_RDI;
  byte in_R8B;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  allocator *paVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  string local_78 [32];
  string local_58 [54];
  allocator local_22;
  byte local_21;
  
  local_21 = in_R8B & 1;
  if ((in_RCX == 0) && (local_21 != 0)) {
    paVar1 = &local_22;
    psVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"upperptr",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    in_RDI = psVar2;
  }
  else if (in_RCX == 0) {
    std::operator+(in_stack_ffffffffffffff48,(char *)in_RDI);
  }
  else {
    __rhs = &stack0xffffffffffffff68;
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+(in_stack_ffffffffffffff28,__rhs);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff58);
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::operator+(in_stack_ffffffffffffff28,__rhs);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  }
  return in_RDI;
}

Assistant:

std::string CppGenerator::getUpperPointer(const std::string rel_name, size_t depth,
    bool parallelize)
{
    if (depth == 0 && parallelize)
        return "upperptr";
    if (depth == 0)
        return rel_name+".size()-1";
    return "upperptr_"+rel_name+"["+std::to_string(depth-1)+"]";
}